

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

void __thiscall Person::~Person(Person *this)

{
  Person *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->bio);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void hibernate(Archive & ar)
  {
    ar & HIBERLITE_NVP(name);
    ar & HIBERLITE_NVP(age);
    ar & HIBERLITE_NVP(bio);
  }